

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O1

int run_test_pipe_server_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  bool bVar3;
  uv_loop_t *unaff_RBX;
  uv_connect_t *puVar4;
  uv_pipe_t *puVar5;
  code **ppcVar6;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_50;
  undefined8 uStack_48;
  undefined1 auStack_40 [40];
  uv_loop_t *local_18;
  uv_loop_t *local_10;
  
  auStack_40._32_8_ = (uv__queue *)0x1b306e;
  puVar2 = (uv_loop_t *)uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    auStack_40._32_8_ = (uv__queue *)0x1b321a;
    run_test_pipe_server_close_cold_9();
LAB_001b321a:
    auStack_40._32_8_ = (uv__queue *)0x1b3227;
    run_test_pipe_server_close_cold_1();
LAB_001b3227:
    auStack_40._32_8_ = (uv__queue *)0x1b3234;
    run_test_pipe_server_close_cold_2();
LAB_001b3234:
    auStack_40._32_8_ = (uv__queue *)0x1b3241;
    run_test_pipe_server_close_cold_3();
LAB_001b3241:
    auStack_40._32_8_ = (uv__queue *)0x1b324e;
    run_test_pipe_server_close_cold_4();
LAB_001b324e:
    auStack_40._32_8_ = (uv__queue *)0x1b325b;
    run_test_pipe_server_close_cold_5();
LAB_001b325b:
    auStack_40._32_8_ = (uv__queue *)0x1b3268;
    run_test_pipe_server_close_cold_6();
  }
  else {
    auStack_40._32_8_ = (uv__queue *)0x1b308b;
    iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
    local_10 = (uv_loop_t *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    unaff_RBX = puVar2;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001b321a;
    auStack_40._32_8_ = (uv__queue *)0x1b30bc;
    iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
    local_10 = (uv_loop_t *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001b3227;
    auStack_40._32_8_ = (uv__queue *)0x1b30ef;
    iVar1 = uv_listen(&pipe_server,0,pipe_server_connection_cb);
    local_10 = (uv_loop_t *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001b3234;
    auStack_40._32_8_ = (uv__queue *)0x1b311e;
    iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
    local_10 = (uv_loop_t *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001b3241;
    auStack_40._32_8_ = (uv__queue *)0x1b315d;
    uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
    auStack_40._32_8_ = (uv__queue *)0x1b3167;
    iVar1 = uv_run(puVar2,0);
    local_10 = (uv_loop_t *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001b324e;
    local_10 = (uv_loop_t *)0x1;
    local_18 = (uv_loop_t *)(long)pipe_client_connect_cb_called;
    if (local_18 != (uv_loop_t *)0x1) goto LAB_001b325b;
    local_10 = (uv_loop_t *)0x2;
    local_18 = (uv_loop_t *)(long)pipe_close_cb_called;
    if (local_18 == (uv_loop_t *)0x2) {
      auStack_40._32_8_ = (uv__queue *)0x1b31dc;
      uv_walk(puVar2,close_walk_cb,0);
      auStack_40._32_8_ = (uv__queue *)0x1b31e6;
      uv_run(puVar2,0);
      local_10 = (uv_loop_t *)0x0;
      auStack_40._32_8_ = (uv__queue *)0x1b31f7;
      iVar1 = uv_loop_close(puVar2);
      local_18 = (uv_loop_t *)(long)iVar1;
      if (local_10 == local_18) {
        auStack_40._32_8_ = (uv__queue *)0x1b320d;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b3275;
    }
  }
  auStack_40._32_8_ = (uv__queue *)0x1b3275;
  run_test_pipe_server_close_cold_7();
LAB_001b3275:
  iVar1 = (int)&local_18;
  auStack_40._32_8_ = pipe_server_connection_cb;
  run_test_pipe_server_close_cold_8();
  auStack_40._32_8_ = SEXT48(iVar1);
  auStack_40._24_8_ = (uv_close_cb)0x0;
  if ((uv__queue *)auStack_40._32_8_ == (uv__queue *)0x0) {
    return iVar1;
  }
  puVar4 = (uv_connect_t *)(auStack_40 + 0x20);
  iVar1 = (int)auStack_40 + 0x18;
  auStack_40._8_8_ = pipe_client_connect_cb;
  pipe_server_connection_cb_cold_1();
  auStack_40._8_8_ = unaff_RBX;
  if (puVar4 == &connect_req) {
    auStack_40._0_8_ = SEXT48(iVar1);
    uStack_48 = 0;
    if ((void *)auStack_40._0_8_ == (void *)0x0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      pcStack_50 = (code *)0x1b32ff;
      uv_close(&pipe_client,pipe_close_cb);
      iVar1 = uv_close(&pipe_server,pipe_close_cb);
      return iVar1;
    }
  }
  else {
    pcStack_50 = (code *)0x1b3318;
    pipe_client_connect_cb_cold_1();
  }
  puVar5 = (uv_pipe_t *)auStack_40;
  pcStack_50 = pipe_close_cb;
  pipe_client_connect_cb_cold_2();
  bVar3 = puVar5 == &pipe_server || puVar5 == &pipe_client;
  pcStack_50 = (code *)(ulong)bVar3;
  if (pcStack_50 != (code *)0x0) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)bVar3;
  }
  ppcVar6 = &pcStack_50;
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar6,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_server_close) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_NOT_NULL(loop);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT_OK(r);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT_OK(r);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, pipe_client_connect_cb_called);
  ASSERT_EQ(2, pipe_close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}